

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall embree::OBJMaterial::OBJMaterial(OBJMaterial *this,string *name)

{
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,name);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__OBJMaterial_002a8ae8;
  (this->base).type = 0;
  this->illum = 0;
  this->d = 1.0;
  this->Ns = 1.0;
  this->Ni = 1.0;
  *(undefined8 *)&(this->Ka).field_0 = 0;
  *(undefined8 *)((long)&(this->Ka).field_0 + 8) = 0;
  *(undefined8 *)&(this->Kd).field_0 = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->Kd).field_0 + 8) = 0x3f8000003f800000;
  *(undefined8 *)&(this->Ks).field_0 = 0;
  *(undefined8 *)((long)&(this->Ks).field_0 + 8) = 0;
  *(undefined8 *)&(this->Kt).field_0 = 0x3f8000003f800000;
  *(undefined8 *)((long)&(this->Kt).field_0 + 8) = 0x3f8000003f800000;
  memset(&this->map_d,0,0xa8);
  return;
}

Assistant:

OBJMaterial (const std::string name = "")
      : SceneGraph::MaterialNode(name), base(MATERIAL_OBJ), illum(0), d(1.f), Ns(1.f), Ni(1.f), Ka(0.f), Kd(1.f), Ks(0.f), Kt(1.0f),
        map_d(nullptr), map_Ka(nullptr), map_Kd(nullptr), map_Ks(nullptr), map_Kt(nullptr), map_Ns(nullptr), map_Displ(nullptr) {}